

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

LdElemIDL * __thiscall
Memory::AllocateArray<Memory::ArenaAllocator,LdElemIDL,false>
          (Memory *this,ArenaAllocator *allocator,offset_in_ArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  LdElemIDL *pLVar2;
  size_t byteSize;
  
  if (count != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(6),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(6),0);
    }
    pLVar2 = (LdElemIDL *)
             new__<Memory::ArenaAllocator>
                       (byteSize,(ArenaAllocator *)this,(offset_in_ArenaAllocator_to_subr)allocator)
    ;
    return pLVar2;
  }
  return (LdElemIDL *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}